

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIDCRegisterMatchers(xmlSchemaValidCtxtPtr vctxt,xmlSchemaElementPtr elemDecl)

{
  xmlSchemaIDCPtr_conflict pxVar1;
  int iVar2;
  xmlSchemaIDCAugPtr_conflict local_48;
  xmlSchemaIDCAugPtr_conflict aidc;
  xmlSchemaIDCPtr_conflict refIdc;
  xmlSchemaIDCPtr_conflict idc;
  xmlSchemaIDCMatcherPtr_conflict last;
  xmlSchemaIDCMatcherPtr_conflict matcher;
  xmlSchemaElementPtr elemDecl_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  idc = (xmlSchemaIDCPtr_conflict)0x0;
  refIdc = (xmlSchemaIDCPtr_conflict)elemDecl->idcs;
  if (refIdc == (xmlSchemaIDCPtr_conflict)0x0) {
    vctxt_local._4_4_ = 0;
  }
  else if (vctxt->inode->idcMatchers == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    do {
      if ((refIdc->type == XML_SCHEMA_TYPE_IDC_KEYREF) &&
         (pxVar1 = (xmlSchemaIDCPtr_conflict)refIdc->ref->item,
         pxVar1 != (xmlSchemaIDCPtr_conflict)0x0)) {
        vctxt->inode->hasKeyrefs = 1;
        for (local_48 = vctxt->aidcs;
            (local_48 != (xmlSchemaIDCAugPtr_conflict)0x0 && (local_48->def != pxVar1));
            local_48 = local_48->next) {
        }
        if (local_48 == (xmlSchemaIDCAugPtr_conflict)0x0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaIDCRegisterMatchers",
                     "Could not find an augmented IDC item for an IDC definition");
          return -1;
        }
        if ((local_48->keyrefDepth == -1) || (vctxt->depth < local_48->keyrefDepth)) {
          local_48->keyrefDepth = vctxt->depth;
        }
      }
      for (local_48 = vctxt->aidcs;
          (local_48 != (xmlSchemaIDCAugPtr_conflict)0x0 && (local_48->def != refIdc));
          local_48 = local_48->next) {
      }
      if (local_48 == (xmlSchemaIDCAugPtr_conflict)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaIDCRegisterMatchers",
                   "Could not find an augmented IDC item for an IDC definition");
        return -1;
      }
      if (vctxt->idcMatcherCache == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
        last = (xmlSchemaIDCMatcherPtr_conflict)(*xmlMalloc)(0x48);
        if (last == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
          xmlSchemaVErrMemory(vctxt,"allocating an IDC matcher",(xmlNodePtr)0x0);
          return -1;
        }
        memset(last,0,0x48);
      }
      else {
        last = vctxt->idcMatcherCache;
        vctxt->idcMatcherCache = last->nextCached;
        last->nextCached = (xmlSchemaIDCMatcherPtr)0x0;
      }
      if (idc == (xmlSchemaIDCPtr_conflict)0x0) {
        vctxt->inode->idcMatchers = last;
      }
      else {
        idc->annot = (xmlSchemaAnnotPtr)last;
      }
      idc = (xmlSchemaIDCPtr_conflict)last;
      last->type = 0;
      last->depth = vctxt->depth;
      last->aidc = local_48;
      last->idcType = local_48->def->type;
      iVar2 = xmlSchemaIDCAddStateObject(vctxt,last,refIdc->selector,1);
      if (iVar2 == -1) {
        return -1;
      }
      refIdc = refIdc->next;
    } while (refIdc != (xmlSchemaIDCPtr)0x0);
    vctxt_local._4_4_ = 0;
  }
  else {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaIDCRegisterMatchers",
               "The chain of IDC matchers is expected to be empty");
    vctxt_local._4_4_ = -1;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaIDCRegisterMatchers(xmlSchemaValidCtxtPtr vctxt,
			     xmlSchemaElementPtr elemDecl)
{
    xmlSchemaIDCMatcherPtr matcher, last = NULL;
    xmlSchemaIDCPtr idc, refIdc;
    xmlSchemaIDCAugPtr aidc;

    idc = (xmlSchemaIDCPtr) elemDecl->idcs;
    if (idc == NULL)
	return (0);

#ifdef DEBUG_IDC
    {
	xmlChar *str = NULL;
	xmlGenericError(xmlGenericErrorContext,
	    "IDC: REGISTER on %s, depth %d\n",
	    (char *) xmlSchemaFormatQName(&str, vctxt->inode->nsName,
		vctxt->inode->localName), vctxt->depth);
	FREE_AND_NULL(str)
    }
#endif
    if (vctxt->inode->idcMatchers != NULL) {
	VERROR_INT("xmlSchemaIDCRegisterMatchers",
	    "The chain of IDC matchers is expected to be empty");
	return (-1);
    }
    do {
	if (idc->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
	    /*
	    * Since IDCs bubbles are expensive we need to know the
	    * depth at which the bubbles should stop; this will be
	    * the depth of the top-most keyref IDC. If no keyref
	    * references a key/unique IDC, the keyrefDepth will
	    * be -1, indicating that no bubbles are needed.
	    */
	    refIdc = (xmlSchemaIDCPtr) idc->ref->item;
	    if (refIdc != NULL) {
		/*
		* Remember that we have keyrefs on this node.
		*/
		vctxt->inode->hasKeyrefs = 1;
		/*
		* Lookup the referenced augmented IDC info.
		*/
		aidc = vctxt->aidcs;
		while (aidc != NULL) {
		    if (aidc->def == refIdc)
			break;
		    aidc = aidc->next;
		}
		if (aidc == NULL) {
		    VERROR_INT("xmlSchemaIDCRegisterMatchers",
			"Could not find an augmented IDC item for an IDC "
			"definition");
		    return (-1);
		}
		if ((aidc->keyrefDepth == -1) ||
		    (vctxt->depth < aidc->keyrefDepth))
		    aidc->keyrefDepth = vctxt->depth;
	    }
	}
	/*
	* Lookup the augmented IDC item for the IDC definition.
	*/
	aidc = vctxt->aidcs;
	while (aidc != NULL) {
	    if (aidc->def == idc)
		break;
	    aidc = aidc->next;
	}
	if (aidc == NULL) {
	    VERROR_INT("xmlSchemaIDCRegisterMatchers",
		"Could not find an augmented IDC item for an IDC definition");
	    return (-1);
	}
	/*
	* Create an IDC matcher for every IDC definition.
	*/
	if (vctxt->idcMatcherCache != NULL) {
	    /*
	    * Reuse a cached matcher.
	    */
	    matcher = vctxt->idcMatcherCache;
	    vctxt->idcMatcherCache = matcher->nextCached;
	    matcher->nextCached = NULL;
	} else {
	    matcher = (xmlSchemaIDCMatcherPtr)
		xmlMalloc(sizeof(xmlSchemaIDCMatcher));
	    if (matcher == NULL) {
		xmlSchemaVErrMemory(vctxt,
		    "allocating an IDC matcher", NULL);
		return (-1);
	    }
	    memset(matcher, 0, sizeof(xmlSchemaIDCMatcher));
	}
	if (last == NULL)
	    vctxt->inode->idcMatchers = matcher;
	else
	    last->next = matcher;
	last = matcher;

	matcher->type = IDC_MATCHER;
	matcher->depth = vctxt->depth;
	matcher->aidc = aidc;
	matcher->idcType = aidc->def->type;
#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:   register matcher\n");
#endif
	/*
	* Init the automaton state object.
	*/
	if (xmlSchemaIDCAddStateObject(vctxt, matcher,
	    idc->selector, XPATH_STATE_OBJ_TYPE_IDC_SELECTOR) == -1)
	    return (-1);

	idc = idc->next;
    } while (idc != NULL);
    return (0);
}